

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O0

locale booster::locale::impl_std::create_codecvt
                 (locale *in,string *locale_name,character_facet_type type,utf8_support utf)

{
  int in_ECX;
  locale *in_RSI;
  _Impl *in_RDI;
  int in_R8D;
  undefined4 unaff_retaddr;
  character_facet_type unaff_retaddr_00;
  locale *in_stack_00000008;
  
  if (in_R8D == 3) {
    util::create_utf8_codecvt(in_stack_00000008,unaff_retaddr_00);
  }
  else if (in_ECX == 1) {
    codecvt_bychar<char>(in_stack_00000008,(string *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  }
  else if (in_ECX == 2) {
    codecvt_bychar<wchar_t>(in_stack_00000008,(string *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  }
  else {
    std::locale::locale((locale *)in_RDI,in_RSI);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_codecvt( std::locale const &in,
                                std::string const &locale_name,
                                character_facet_type type,
                                utf8_support utf) 
    {
        if(utf == utf8_from_wide) {
            return util::create_utf8_codecvt(in,type);
        }
        switch(type) {
        case char_facet:
            return codecvt_bychar<char>(in,locale_name);
        case wchar_t_facet:
            return codecvt_bychar<wchar_t>(in,locale_name);
        #if defined(BOOSTER_HAS_CHAR16_T) && !defined(BOOSTER_NO_CHAR16_T_CODECVT)
        case char16_t_facet:
            return codecvt_bychar<char16_t>(in,locale_name);
        #endif
        #if defined(BOOSTER_HAS_CHAR32_T) && !defined(BOOSTER_NO_CHAR32_T_CODECVT)
        case char32_t_facet:
            return codecvt_bychar<char32_t>(in,locale_name);
        #endif
        default:
            return in;
        }
    }